

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaPSimpleTypeErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaBasicItemPtr ownerItem,
               xmlNodePtr node,xmlSchemaTypePtr type,char *expected,xmlChar *value,char *message,
               xmlChar *str1,xmlChar *str2)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *local_58;
  xmlChar *expectedEscaped;
  xmlChar *qName;
  xmlChar *str;
  xmlChar *msg;
  char *expected_local;
  xmlSchemaTypePtr type_local;
  xmlNodePtr node_local;
  xmlSchemaBasicItemPtr ownerItem_local;
  xmlSchemaParserCtxtPtr pxStack_10;
  xmlParserErrors error_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  str = (xmlChar *)0x0;
  msg = (xmlChar *)expected;
  expected_local = (char *)type;
  type_local = (xmlSchemaTypePtr)node;
  node_local = (xmlNodePtr)ownerItem;
  ownerItem_local._4_4_ = error;
  pxStack_10 = ctxt;
  xmlSchemaFormatNodeForError(&str,(xmlSchemaAbstractCtxtPtr)ctxt,node);
  if (message == (char *)0x0) {
    if (expected_local == (char *)0x0) {
      if (*(int *)&type_local->next == 2) {
        str = xmlStrcat(str,(xmlChar *)"The value \'%s\' is not valid.");
      }
      else {
        str = xmlStrcat(str,(xmlChar *)"The character content is not valid.");
      }
    }
    else {
      if (*(int *)&type_local->next == 2) {
        str = xmlStrcat(str,(xmlChar *)"\'%s\' is not a valid value of ");
      }
      else {
        str = xmlStrcat(str,(xmlChar *)"The character content is not a valid value of ");
      }
      iVar1 = xmlSchemaIsGlobalItem((xmlSchemaTypePtr)expected_local);
      if (iVar1 == 0) {
        str = xmlStrcat(str,(xmlChar *)"the local ");
      }
      else {
        str = xmlStrcat(str,(xmlChar *)"the ");
      }
      if ((*(uint *)(expected_local + 0x58) & 0x100) == 0) {
        if ((*(uint *)(expected_local + 0x58) & 0x40) == 0) {
          if ((*(uint *)(expected_local + 0x58) & 0x80) != 0) {
            str = xmlStrcat(str,"union type");
          }
        }
        else {
          str = xmlStrcat(str,"list type");
        }
      }
      else {
        str = xmlStrcat(str,(xmlChar *)"atomic type");
      }
      iVar1 = xmlSchemaIsGlobalItem((xmlSchemaTypePtr)expected_local);
      if (iVar1 != 0) {
        qName = (xmlChar *)0x0;
        str = xmlStrcat(str," \'");
        if (*(int *)(expected_local + 0xa0) == 0) {
          expectedEscaped =
               xmlSchemaFormatQName
                         (&qName,*(xmlChar **)(expected_local + 0xd0),
                          *(xmlChar **)(expected_local + 0x10));
          if (qName == (xmlChar *)0x0) {
            qName = xmlStrdup(expectedEscaped);
          }
        }
        else {
          str = xmlStrcat(str,"xs:");
          qName = xmlStrdup(*(xmlChar **)(expected_local + 0x10));
        }
        pxVar3 = str;
        pxVar2 = xmlEscapeFormatString(&qName);
        str = xmlStrcat(pxVar3,pxVar2);
        str = xmlStrcat(str,(xmlChar *)"\'.");
        if (qName != (xmlChar *)0x0) {
          (*xmlFree)(qName);
          qName = (xmlChar *)0x0;
        }
      }
    }
    if (msg == (xmlChar *)0x0) {
      str = xmlStrcat(str,"\n");
    }
    else {
      local_58 = xmlCharStrdup((char *)msg);
      pxVar3 = xmlStrcat(str,(xmlChar *)" Expected is \'");
      str = pxVar3;
      pxVar2 = xmlEscapeFormatString(&local_58);
      str = xmlStrcat(pxVar3,pxVar2);
      if (local_58 != (xmlChar *)0x0) {
        (*xmlFree)(local_58);
        local_58 = (xmlChar *)0x0;
      }
      str = xmlStrcat(str,"\'.\n");
    }
    if (*(int *)&type_local->next == 2) {
      xmlSchemaPErr(pxStack_10,(xmlNodePtr)type_local,ownerItem_local._4_4_,(char *)str,value,
                    (xmlChar *)0x0);
    }
    else {
      xmlSchemaPErr(pxStack_10,(xmlNodePtr)type_local,ownerItem_local._4_4_,(char *)str,
                    (xmlChar *)0x0,(xmlChar *)0x0);
    }
  }
  else {
    str = xmlStrcat(str,(xmlChar *)message);
    str = xmlStrcat(str,".\n");
    xmlSchemaPErrExt(pxStack_10,(xmlNodePtr)type_local,ownerItem_local._4_4_,(xmlChar *)0x0,
                     (xmlChar *)0x0,(xmlChar *)0x0,(char *)str,str1,str2,(xmlChar *)0x0,
                     (xmlChar *)0x0,(xmlChar *)0x0);
  }
  if (str != (xmlChar *)0x0) {
    (*xmlFree)(str);
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(8,0)
xmlSchemaPSimpleTypeErr(xmlSchemaParserCtxtPtr ctxt,
			xmlParserErrors error,
			xmlSchemaBasicItemPtr ownerItem ATTRIBUTE_UNUSED,
			xmlNodePtr node,
			xmlSchemaTypePtr type,
			const char *expected,
			const xmlChar *value,
			const char *message,
			const xmlChar *str1,
			const xmlChar *str2)
{
    xmlChar *msg = NULL;

    xmlSchemaFormatNodeForError(&msg, ACTXT_CAST ctxt, node);
    if (message == NULL) {
	/*
	* Use default messages.
	*/
	if (type != NULL) {
	    if (node->type == XML_ATTRIBUTE_NODE)
		msg = xmlStrcat(msg, BAD_CAST "'%s' is not a valid value of ");
	    else
		msg = xmlStrcat(msg, BAD_CAST "The character content is not a "
		"valid value of ");
	    if (! xmlSchemaIsGlobalItem(type))
		msg = xmlStrcat(msg, BAD_CAST "the local ");
	    else
		msg = xmlStrcat(msg, BAD_CAST "the ");

	    if (WXS_IS_ATOMIC(type))
		msg = xmlStrcat(msg, BAD_CAST "atomic type");
	    else if (WXS_IS_LIST(type))
		msg = xmlStrcat(msg, BAD_CAST "list type");
	    else if (WXS_IS_UNION(type))
		msg = xmlStrcat(msg, BAD_CAST "union type");

	    if (xmlSchemaIsGlobalItem(type)) {
		xmlChar *str = NULL;
		msg = xmlStrcat(msg, BAD_CAST " '");
		if (type->builtInType != 0) {
		    msg = xmlStrcat(msg, BAD_CAST "xs:");
		    str = xmlStrdup(type->name);
		} else {
		    const xmlChar *qName = xmlSchemaFormatQName(&str, type->targetNamespace, type->name);
		    if (!str)
			str = xmlStrdup(qName);
		}
		msg = xmlStrcat(msg, xmlEscapeFormatString(&str));
		msg = xmlStrcat(msg, BAD_CAST "'.");
		FREE_AND_NULL(str);
	    }
	} else {
	    if (node->type == XML_ATTRIBUTE_NODE)
		msg = xmlStrcat(msg, BAD_CAST "The value '%s' is not valid.");
	    else
		msg = xmlStrcat(msg, BAD_CAST "The character content is not "
		"valid.");
	}
	if (expected) {
	    xmlChar *expectedEscaped = xmlCharStrdup(expected);
	    msg = xmlStrcat(msg, BAD_CAST " Expected is '");
	    msg = xmlStrcat(msg, xmlEscapeFormatString(&expectedEscaped));
	    FREE_AND_NULL(expectedEscaped);
	    msg = xmlStrcat(msg, BAD_CAST "'.\n");
	} else
	    msg = xmlStrcat(msg, BAD_CAST "\n");
	if (node->type == XML_ATTRIBUTE_NODE)
	    xmlSchemaPErr(ctxt, node, error, (const char *) msg, value, NULL);
	else
	    xmlSchemaPErr(ctxt, node, error, (const char *) msg, NULL, NULL);
    }